

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglChooseConfigReference.cpp
# Opt level: O0

int deqp::egl::SurfaceConfig::getYuvOrderRank(EGLenum order)

{
  TestError *this;
  char *message;
  Enum<int,_2UL> EVar1;
  GetNameFunc local_98;
  int local_90;
  string local_88;
  allocator<char> local_51;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_30;
  EGLenum local_10;
  int local_c;
  EGLenum order_local;
  
  if (order == 0x3038) {
    local_c = 0;
  }
  else if (order == 0x3302) {
    local_c = 1;
  }
  else if (order == 0x3303) {
    local_c = 2;
  }
  else if (order == 0x3304) {
    local_c = 3;
  }
  else if (order == 0x3305) {
    local_c = 5;
  }
  else if (order == 0x3306) {
    local_c = 4;
  }
  else if (order == 0x3307) {
    local_c = 6;
  }
  else {
    if (order != 0x3308) {
      local_10 = order;
      this = (TestError *)__cxa_allocate_exception(0x38);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_50,"Unknown YUV order: ",&local_51);
      EVar1 = eglu::getYuvOrderStr(local_10);
      local_98 = EVar1.m_getName;
      local_90 = EVar1.m_value;
      tcu::Format::Enum<int,2ul>::toString_abi_cxx11_(&local_88,&local_98);
      std::operator+(&local_30,&local_50,&local_88);
      message = (char *)std::__cxx11::string::c_str();
      tcu::TestError::TestError
                (this,message,(char *)0x0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglChooseConfigReference.cpp"
                 ,0x81);
      __cxa_throw(this,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
    }
    local_c = 7;
  }
  return local_c;
}

Assistant:

static int getYuvOrderRank (EGLenum order)
	{
		switch (order)
		{
			case EGL_NONE:					return 0;
			case EGL_YUV_ORDER_YUV_EXT:		return 1;
			case EGL_YUV_ORDER_YVU_EXT:		return 2;
			case EGL_YUV_ORDER_YUYV_EXT:	return 3;
			case EGL_YUV_ORDER_YVYU_EXT:	return 4;
			case EGL_YUV_ORDER_UYVY_EXT:	return 5;
			case EGL_YUV_ORDER_VYUY_EXT:	return 6;
			case EGL_YUV_ORDER_AYUV_EXT:	return 7;
			default:
				TCU_THROW(TestError, (std::string("Unknown YUV order: ") + eglu::getYuvOrderStr(order).toString()).c_str());
		}
	}